

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_mask_sse4.h
# Opt level: O0

void aom_lowbd_blend_a64_d16_mask_subw0_subh1_w4_sse4_1
               (uint8_t *dst,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int h,
               __m128i *round_offset,int shift)

{
  uint in_ECX;
  __m128i *in_RDX;
  uint in_ESI;
  CONV_BUF_TYPE *in_RDI;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [64];
  void *in_stack_00000008;
  __m128i m;
  __m128i m_ac;
  __m128i m_i1;
  __m128i m_i0;
  int i;
  __m128i zeros;
  __m128i v_maxval;
  int local_ec;
  ulong uStack_e0;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff60;
  undefined6 in_stack_ffffffffffffff70;
  undefined2 uVar4;
  
  uVar4 = 0x40;
  auVar1 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
  auVar1 = vpinsrw_avx(auVar1,0x40,2);
  auVar1 = vpinsrw_avx(auVar1,0x40,3);
  auVar1 = vpinsrw_avx(auVar1,0x40,4);
  auVar1 = vpinsrw_avx(auVar1,0x40,5);
  auVar1 = vpinsrw_avx(auVar1,0x40,6);
  vpinsrw_avx(auVar1,0x40,7);
  auVar3 = ZEXT1664(ZEXT816(0) << 0x20);
  for (local_ec = 0; auVar1 = auVar3._0_16_, local_ec < (int)m[1]; local_ec = local_ec + 1) {
    xx_loadl_64(in_stack_00000008);
    auVar2 = auVar1;
    xx_loadl_64((void *)((long)in_stack_00000008 + (ulong)(uint)m[0]));
    auVar1 = vpaddusb_avx(auVar1,auVar2);
    uStack_e0 = SUB168(ZEXT816(0),4);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uStack_e0;
    auVar2 = vpavgb_avx(auVar1,auVar2 << 0x40);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = auVar2._0_8_;
    auVar1 = vpmovzxbw_avx(auVar1);
    auVar3 = ZEXT1664(auVar1);
    blend_a64_d16_mask_w4_sse41
              (auVar2._0_8_,(CONV_BUF_TYPE *)CONCAT26(uVar4,in_stack_ffffffffffffff70),in_RDI,
               (__m128i *)CONCAT44(in_ESI,in_stack_ffffffffffffff60),in_RDX,
               (__m128i *)CONCAT44(in_ECX,in_stack_ffffffffffffff50),(int)src1);
    in_stack_00000008 = (void *)((long)in_stack_00000008 + (ulong)((uint)m[0] << 1));
    in_RDI = (CONV_BUF_TYPE *)((long)in_RDI + (ulong)in_ESI);
    in_RDX = (__m128i *)((long)*in_RDX + (ulong)in_ECX * 2);
  }
  return;
}

Assistant:

static inline void aom_lowbd_blend_a64_d16_mask_subw0_subh1_w4_sse4_1(
    uint8_t *dst, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int h,
    const __m128i *round_offset, int shift) {
  const __m128i v_maxval = _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);
  const __m128i zeros = _mm_setzero_si128();
  for (int i = 0; i < h; ++i) {
    const __m128i m_i0 = xx_loadl_64(mask);
    const __m128i m_i1 = xx_loadl_64(mask + mask_stride);
    const __m128i m_ac = _mm_adds_epu8(m_i0, m_i1);
    const __m128i m = _mm_cvtepu8_epi16(_mm_avg_epu8(m_ac, zeros));

    blend_a64_d16_mask_w4_sse41(dst, src0, src1, &m, round_offset, &v_maxval,
                                shift);
    mask += mask_stride << 1;
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
  }
}